

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

mg_connection * mg_if_accept_tcp_cb(mg_connection *lc,socket_address *sa,size_t sa_len)

{
  mg_add_sock_opts opts_00;
  mg_connection *nc;
  mg_add_sock_opts opts;
  size_t sa_len_local;
  socket_address *sa_local;
  mg_connection *lc_local;
  
  opts.error_string = (char **)sa_len;
  memset(&nc,0,0x18);
  opts_00._8_8_ = opts.user_data;
  opts_00.user_data = nc;
  opts_00.error_string = (char **)opts._8_8_;
  lc_local = mg_create_connection(lc->mgr,lc->handler,opts_00);
  if (lc_local == (mg_connection *)0x0) {
    lc_local = (mg_connection *)0x0;
  }
  else {
    lc_local->listener = lc;
    lc_local->proto_data = lc->proto_data;
    lc_local->proto_handler = lc->proto_handler;
    lc_local->user_data = lc->user_data;
    lc_local->recv_mbuf_limit = lc->recv_mbuf_limit;
    *(undefined8 *)&lc_local->sa = *(undefined8 *)sa;
    *(undefined8 *)((long)&lc_local->sa + 8) = *(undefined8 *)((sa->sa).sa_data + 6);
    mg_add_conn(lc_local->mgr,lc_local);
    if (lc->ssl_ctx == (SSL_CTX *)0x0) {
      mg_call(lc_local,(mg_event_handler_t)0x0,1,&lc_local->sa);
    }
    if (LL_DEBUG < s_cs_log_level) {
      fprintf(_stderr,"%-20s ","mg_if_accept_tcp_cb");
      cs_log_printf("%p %p %d %d, %p %p",lc,lc_local,(ulong)(uint)lc_local->sock,
                    lc_local->flags & 0xffffffff,lc->ssl_ctx,lc_local->ssl);
    }
  }
  return lc_local;
}

Assistant:

struct mg_connection *mg_if_accept_tcp_cb(struct mg_connection *lc,
                                          union socket_address *sa,
                                          size_t sa_len) {
    struct mg_add_sock_opts opts;
    struct mg_connection *nc;
    (void) sa_len;
    memset(&opts, 0, sizeof(opts));
    nc = mg_create_connection(lc->mgr, lc->handler, opts);
    if (nc == NULL) return NULL;
    nc->listener = lc;
    nc->proto_data = lc->proto_data;
    nc->proto_handler = lc->proto_handler;
    nc->user_data = lc->user_data;
    nc->recv_mbuf_limit = lc->recv_mbuf_limit;
    nc->sa = *sa;
    mg_add_conn(nc->mgr, nc);
    if (lc->ssl_ctx == NULL) {
        /* For non-SSL connections deliver MG_EV_ACCEPT right away. */
        mg_call(nc, NULL, MG_EV_ACCEPT, &nc->sa);
    }
    DBG(("%p %p %d %d, %p %p", lc, nc, nc->sock, (int) nc->flags, lc->ssl_ctx,
            nc->ssl));
    return nc;
}